

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  secp256k1_ge *unaff_retaddr;
  secp256k1_ge Q;
  secp256k1_ge *in_stack_ffffffffffffff68;
  secp256k1_callback *in_stack_ffffffffffffff70;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0xfd,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    iVar1 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      iVar1 = 0;
    }
    else {
      iVar1 = secp256k1_eckey_pubkey_parse
                        ((secp256k1_ge *)Q.x.n[0],(uchar *)unaff_retaddr,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = secp256k1_ge_is_in_correct_subgroup(unaff_retaddr);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          secp256k1_pubkey_save
                    ((secp256k1_pubkey *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          secp256k1_ge_clear((secp256k1_ge *)0x101d2e);
          iVar1 = 1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}